

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::number::impl::MutablePatternModifier::getSymbol
          (UnicodeString *__return_storage_ptr__,MutablePatternModifier *this,AffixPatternType type)

{
  UNumberUnitWidth UVar1;
  long lVar2;
  UErrorCode localStatus;
  UErrorCode local_c;
  
  local_c = U_ZERO_ERROR;
  switch(type) {
  case TYPE_CURRENCY_QUINT:
  case TYPE_CURRENCY_QUAD:
    UnicodeString::UnicodeString(__return_storage_ptr__,anon_var_dwarf_192d41);
    return __return_storage_ptr__;
  case TYPE_CURRENCY_TRIPLE:
    CurrencySymbols::getPluralName
              (__return_storage_ptr__,this->fCurrencySymbols,this->fPlural,&local_c);
    return __return_storage_ptr__;
  case TYPE_CURRENCY_SINGLE:
    UVar1 = this->fUnitWidth;
    if (UVar1 == UNUM_UNIT_WIDTH_NARROW) {
      CurrencySymbols::getNarrowCurrencySymbol
                (__return_storage_ptr__,this->fCurrencySymbols,&local_c);
      return __return_storage_ptr__;
    }
    if (UVar1 == UNUM_UNIT_WIDTH_HIDDEN) goto switchD_00264cf6_default;
    if (UVar1 != UNUM_UNIT_WIDTH_ISO_CODE) {
      CurrencySymbols::getCurrencySymbol(__return_storage_ptr__,this->fCurrencySymbols,&local_c);
      return __return_storage_ptr__;
    }
  case TYPE_CURRENCY_DOUBLE:
    CurrencySymbols::getIntlCurrencySymbol(__return_storage_ptr__,this->fCurrencySymbols,&local_c);
    return __return_storage_ptr__;
  case TYPE_PERMILLE:
    lVar2 = 0x308;
    break;
  case TYPE_PERCENT:
    lVar2 = 200;
    break;
  case TYPE_PLUS_SIGN:
    lVar2 = 0x1c8;
    break;
  case TYPE_MINUS_SIGN:
    lVar2 = 0x188;
    break;
  default:
switchD_00264cf6_default:
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003e4fd8;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    return __return_storage_ptr__;
  }
  UnicodeString::UnicodeString
            (__return_storage_ptr__,
             (UnicodeString *)((long)&(this->fSymbols->super_UObject)._vptr_UObject + lVar2));
  return __return_storage_ptr__;
}

Assistant:

UnicodeString MutablePatternModifier::getSymbol(AffixPatternType type) const {
    UErrorCode localStatus = U_ZERO_ERROR;
    switch (type) {
        case AffixPatternType::TYPE_MINUS_SIGN:
            return fSymbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kMinusSignSymbol);
        case AffixPatternType::TYPE_PLUS_SIGN:
            return fSymbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kPlusSignSymbol);
        case AffixPatternType::TYPE_PERCENT:
            return fSymbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kPercentSymbol);
        case AffixPatternType::TYPE_PERMILLE:
            return fSymbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kPerMillSymbol);
        case AffixPatternType::TYPE_CURRENCY_SINGLE: {
            // UnitWidth ISO and HIDDEN overrides the singular currency symbol.
            if (fUnitWidth == UNumberUnitWidth::UNUM_UNIT_WIDTH_ISO_CODE) {
                return fCurrencySymbols->getIntlCurrencySymbol(localStatus);
            } else if (fUnitWidth == UNumberUnitWidth::UNUM_UNIT_WIDTH_HIDDEN) {
                return UnicodeString();
            } else if (fUnitWidth == UNumberUnitWidth::UNUM_UNIT_WIDTH_NARROW) {
                return fCurrencySymbols->getNarrowCurrencySymbol(localStatus);
            } else {
                return fCurrencySymbols->getCurrencySymbol(localStatus);
            }
        }
        case AffixPatternType::TYPE_CURRENCY_DOUBLE:
            return fCurrencySymbols->getIntlCurrencySymbol(localStatus);
        case AffixPatternType::TYPE_CURRENCY_TRIPLE:
            // NOTE: This is the code path only for patterns containing "¤¤¤".
            // Plural currencies set via the API are formatted in LongNameHandler.
            // This code path is used by DecimalFormat via CurrencyPluralInfo.
            U_ASSERT(fPlural != StandardPlural::Form::COUNT);
            return fCurrencySymbols->getPluralName(fPlural, localStatus);
        case AffixPatternType::TYPE_CURRENCY_QUAD:
            return UnicodeString(u"\uFFFD");
        case AffixPatternType::TYPE_CURRENCY_QUINT:
            return UnicodeString(u"\uFFFD");
        default:
            U_ASSERT(false);
            return UnicodeString();
    }
}